

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_initCStream_usingCDict
                 (ZSTDMT_CCtx *mtctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params params;
  size_t sVar1;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  void *pvStack_100;
  undefined1 local_f4 [24];
  ZSTD_strategy local_dc;
  undefined1 local_d8 [4];
  undefined1 auStack_d4 [4];
  ZSTD_CCtx_params cctxParams;
  unsigned_long_long pledgedSrcSize_local;
  ZSTD_CDict *cdict_local;
  ZSTDMT_CCtx *mtctx_local;
  ZSTD_frameParameters fParams_local;
  
  cctxParams.customMem.opaque = (void *)pledgedSrcSize;
  memcpy(local_d8,&mtctx->params,0x90);
  if (cdict == (ZSTD_CDict *)0x0) {
    fParams_local.checksumFlag = -0x20;
    fParams_local.noDictIDFlag = -1;
  }
  else {
    ZSTD_getCParamsFromCDict((ZSTD_compressionParameters *)local_f4,cdict);
    auStack_d4 = (undefined1  [4])local_f4._0_4_;
    cctxParams.format = local_f4._4_4_;
    cctxParams.cParams.windowLog = local_f4._8_4_;
    cctxParams.cParams.chainLog = local_f4._12_4_;
    cctxParams.cParams.hashLog = local_f4._16_4_;
    cctxParams.cParams.searchLog = local_f4._20_4_;
    cctxParams.cParams.minMatch = local_dc;
    cctxParams.cParams._20_8_ = fParams._0_8_;
    cctxParams.fParams.contentSizeFlag = fParams.noDictIDFlag;
    memcpy(&local_188,local_d8,0x90);
    params.cParams.chainLog = (undefined4)uStack_180;
    params.cParams.hashLog = uStack_180._4_4_;
    params.format = (undefined4)local_188;
    params.cParams.windowLog = local_188._4_4_;
    params.cParams.searchLog = (undefined4)uStack_178;
    params.cParams.minMatch = uStack_178._4_4_;
    params.cParams.targetLength = (undefined4)uStack_170;
    params.cParams.strategy = uStack_170._4_4_;
    params.fParams.contentSizeFlag = (undefined4)local_168;
    params.fParams.checksumFlag = local_168._4_4_;
    params.fParams.noDictIDFlag = (undefined4)uStack_160;
    params.compressionLevel = uStack_160._4_4_;
    params._48_8_ = uStack_158;
    params.targetCBlockSize = uStack_150;
    params.srcSizeHint = (undefined4)local_148;
    params.attachDictPref = local_148._4_4_;
    params.literalCompressionMode = (undefined4)uStack_140;
    params.nbWorkers = uStack_140._4_4_;
    params.jobSize = uStack_138;
    params.overlapLog = (undefined4)uStack_130;
    params.rsyncable = uStack_130._4_4_;
    params.ldmParams.enableLdm = (undefined4)uStack_128;
    params.ldmParams.hashLog = uStack_128._4_4_;
    params.ldmParams.bucketSizeLog = (undefined4)uStack_120;
    params.ldmParams.minMatchLength = uStack_120._4_4_;
    params.ldmParams.hashRateLog = (undefined4)local_118;
    params.ldmParams.windowLog = local_118._4_4_;
    params.customMem.customAlloc = (ZSTD_allocFunction)uStack_110;
    params.customMem.customFree = (ZSTD_freeFunction)uStack_108;
    params.customMem.opaque = pvStack_100;
    fParams_local._4_8_ =
         ZSTDMT_initCStream_internal
                   (mtctx,(void *)0x0,0,ZSTD_dct_auto,cdict,params,
                    (unsigned_long_long)cctxParams.customMem.opaque);
  }
  sVar1._0_4_ = fParams_local.checksumFlag;
  sVar1._4_4_ = fParams_local.noDictIDFlag;
  return sVar1;
}

Assistant:

size_t ZSTDMT_initCStream_usingCDict(ZSTDMT_CCtx* mtctx,
                               const ZSTD_CDict* cdict,
                                     ZSTD_frameParameters fParams,
                                     unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams = mtctx->params;
    if (cdict==NULL) return ERROR(dictionary_wrong);   /* method incompatible with NULL cdict */
    cctxParams.cParams = ZSTD_getCParamsFromCDict(cdict);
    cctxParams.fParams = fParams;
    return ZSTDMT_initCStream_internal(mtctx, NULL, 0 /*dictSize*/, ZSTD_dct_auto, cdict,
                                       cctxParams, pledgedSrcSize);
}